

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O1

char * __thiscall ON_Locale::GetAppleLocaleName(ON_Locale *this,char *buffer,size_t buffer_capacity)

{
  char *dest;
  char *pcVar1;
  
  if (buffer == (char *)0x0 || buffer_capacity == 0) {
    pcVar1 = (char *)0x0;
  }
  else {
    memset(buffer,0,buffer_capacity);
    pcVar1 = buffer + buffer_capacity;
  }
  dest = LocaleStringBuilder('\0',this->m_language_subtag,9,buffer,pcVar1);
  pcVar1 = LocaleStringBuilder('_',this->m_region_subtag,5,dest,pcVar1);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = buffer;
  }
  return pcVar1;
}

Assistant:

const char* ON_Locale::GetAppleLocaleName(
  char* buffer,
  size_t buffer_capacity
  ) const
{
  char* buffer_end = LocaleStringBuilderDestEnd(buffer,buffer_capacity);
  char* s = buffer;
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG(0,m_language_subtag),s,buffer_end);
  // Apple local names omit script


  // Apple local names use an underbar before <REGION>
  // s = LocaleStringBuilder(ON_LOCALE_SUBTAG('-',m_script_subtag),s,buffer_end);
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG('_',m_region_subtag),s,buffer_end);
  return ( nullptr == s ) ? nullptr : buffer;
}